

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

string * __thiscall
gvr::PLYElement::toString_abi_cxx11_(string *__return_storage_ptr__,PLYElement *this)

{
  ostream *poVar1;
  ostringstream s;
  ostringstream aoStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  if (this->size < 0) {
    poVar1 = std::operator<<((ostream *)aoStack_188,"comment ");
    std::operator<<(poVar1,(string *)this);
  }
  else {
    poVar1 = std::operator<<((ostream *)aoStack_188,"element ");
    poVar1 = std::operator<<(poVar1,(string *)this);
    poVar1 = std::operator<<(poVar1," ");
    std::ostream::_M_insert<long>((long)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string PLYElement::toString() const
{
  std::ostringstream s;

  if (size >= 0)
  {
    s << "element " << name << " " << size;
  }
  else
  {
    s << "comment " << name;
  }

  return s.str();
}